

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_del.c
# Opt level: O2

int mpt_path_del(mpt_path *path)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  uint8_t *puVar4;
  char *pcVar5;
  long lVar6;
  ulong len;
  ulong uVar7;
  mpt_array local_20;
  
  uVar1 = path->len;
  if (uVar1 == 0) {
    return -0x10;
  }
  pcVar5 = path->base;
  sVar2 = path->off;
  if ((char)path->flags < '\0') {
    if (uVar1 == 1) {
      return -2;
    }
    uVar7 = (ulong)(byte)pcVar5[sVar2 + uVar1 + -2];
    lVar6 = uVar1 - uVar7;
    if (uVar1 < uVar7 || lVar6 == 0) {
      return -2;
    }
    puVar4 = (uint8_t *)(pcVar5 + lVar6 + sVar2 + -3);
    if (lVar6 + sVar2 == 2) {
      puVar4 = &path->first;
    }
    if (pcVar5[sVar2 + uVar1 + -2] == *puVar4) {
      len = lVar6 - 2;
      goto LAB_0010d778;
    }
LAB_0010d7c6:
    iVar3 = -4;
  }
  else {
    uVar7 = 0;
    len = uVar1 - 1;
    while (len != 0) {
      if ((uint)(byte)pcVar5[len + (sVar2 - 1)] == (int)path->sep) goto LAB_0010d778;
      uVar7 = uVar7 + 1;
      len = len - 1;
    }
    len = 0;
    uVar7 = uVar1 - 1;
LAB_0010d778:
    if ((path->flags & 0x40) != 0) {
      local_20._buf = (mpt_buffer *)(pcVar5 + -0x20);
      if (*(ulong *)(pcVar5 + -8) < len) {
        return -2;
      }
      pcVar5 = (char *)mpt_array_slice(&local_20,0,len);
      if (pcVar5 == (char *)0x0) goto LAB_0010d7c6;
      path->base = pcVar5;
      (local_20._buf)->_used = len;
    }
    path->len = len;
    if (len == 0) {
      path->first = '\0';
    }
    path->flags = path->flags & 0xfe;
    iVar3 = (int)uVar7;
  }
  return iVar3;
}

Assistant:

extern int mpt_path_del(MPT_STRUCT(path) *path)
{
	uint8_t *data;
	size_t len, pos, part;
	
	if (!(len = path->len)) {
		return MPT_ERROR(MissingData);
	}
	data = (uint8_t *) path->base;
	pos  = len + path->off;
	
	/* binary linked size separation format */
	if (path->flags & MPT_PATHFLAG(SepBinary)) {
		/* total length error */
		if (len < 2 || len <= (part = data[pos-2])) {
			return MPT_ERROR(BadValue);
		}
		len -= part + 2;
		pos  = len + path->off;
		
		/* forward/backward inconsistency */
		if (part != (pos ? data[pos-1] : path->first)) {
			return MPT_ERROR(BadOperation);
		}
	}
	else {
		/* start on character before assign */
		data += (pos - 2);
		part  = 0;
		
		/* find last separator */
		while (--len && (*(data) != path->sep)) {
			++part; --data;
		}
	}
	if (path->flags & MPT_PATHFLAG(HasArray)) {
		MPT_STRUCT(array) arr;
		arr._buf = (void *) path->base;
		pos = (--arr._buf)->_used;
		if (len > pos) {
			return MPT_ERROR(BadValue);
		}
		pos = len;
		if (!(data = mpt_array_slice(&arr, 0, pos))) {
			return MPT_ERROR(BadOperation);
		}
		path->base = (char *) data;
		arr._buf->_used = pos;
	}
	
	if (!(path->len = len)) {
		path->first = 0;
	}
	path->flags &= ~MPT_PATHFLAG(KeepPost);
	
	return part;
}